

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  __time_t _Var9;
  __suseconds_t _Var10;
  int16_t i;
  int iVar11;
  double *x0;
  double *u0;
  double *pdVar12;
  double *p0;
  long lVar13;
  FILE *__stream;
  FILE *__stream_00;
  uint16_t i_1;
  int16_t i_2;
  long lVar14;
  int j;
  timeval tv;
  Cgmres<Model> controller;
  double local_d8;
  timeval local_b8;
  double *local_a8;
  Cgmres<Model> local_a0;
  
  x0 = (double *)operator_new__(0x20);
  u0 = (double *)operator_new__(0x30);
  pdVar12 = (double *)operator_new__(0x20);
  p0 = (double *)operator_new__(0x330);
  *x0 = 2.0;
  x0[1] = 2.0;
  x0[2] = 0.0;
  x0[3] = 0.0;
  *u0 = 0.0;
  u0[1] = 0.0;
  u0[2] = 10.0;
  u0[3] = 10.0;
  u0[4] = 0.0005;
  u0[5] = 0.0005;
  pdVar12[2] = 0.0;
  pdVar12[3] = 0.0;
  *pdVar12 = 0.0;
  pdVar12[1] = 0.0;
  lVar13 = 0;
  do {
    *(undefined8 *)((long)p0 + lVar13) = 0x3ff0000000000000;
    ((undefined8 *)((long)p0 + lVar13))[1] = 0xbff0000000000000;
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x330);
  Cgmres<Model>::Cgmres(&local_a0);
  lVar13 = 0;
  do {
    local_a0.ptau[lVar13] = p0[lVar13];
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x66);
  lVar13 = 0;
  do {
    lVar14 = 0;
    do {
      local_a0.U[lVar14] = u0[lVar14];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 6);
    lVar13 = lVar13 + 1;
    local_a0.U = local_a0.U + 6;
  } while (lVar13 != 0x32);
  Cgmres<Model>::init_u0_newton(&local_a0,u0,x0,p0,10);
  __stream = fopen("mass_spring_damper_x.txt","w");
  __stream_00 = fopen("mass_spring_damper_u.txt","w");
  if (__stream_00 != (FILE *)0x0 && __stream != (FILE *)0x0) {
    local_d8 = 0.0;
    iVar11 = 0;
    local_a8 = p0;
    do {
      gettimeofday(&local_b8,(__timezone_ptr_t)0x0);
      _Var10 = local_b8.tv_usec;
      _Var9 = local_b8.tv_sec;
      Cgmres<Model>::control(&local_a0,u0,x0);
      gettimeofday(&local_b8,(__timezone_ptr_t)0x0);
      dVar3 = (double)local_b8.tv_sec;
      dVar6 = (double)local_b8.tv_usec;
      dVar7 = x0[2];
      dVar8 = x0[3];
      *pdVar12 = dVar7;
      pdVar12[1] = dVar8;
      dVar4 = u0[1] + (((*x0 - x0[1]) + dVar7) - dVar8);
      auVar1._8_4_ = SUB84(dVar4,0);
      auVar1._0_8_ = *u0 + ((x0[1] - *x0) - (dVar7 + dVar7)) + dVar8;
      auVar1._12_4_ = (int)((ulong)dVar4 >> 0x20);
      *(undefined1 (*) [16])(pdVar12 + 2) = auVar1;
      lVar13 = 0;
      do {
        dVar4 = (pdVar12 + lVar13)[1] * 0.001;
        auVar2._8_4_ = SUB84(dVar4,0);
        auVar2._0_8_ = pdVar12[lVar13] * 0.001;
        auVar2._12_4_ = (int)((ulong)dVar4 >> 0x20);
        *(undefined1 (*) [16])(pdVar12 + lVar13) = auVar2;
        lVar13 = lVar13 + 2;
      } while (lVar13 != 4);
      lVar13 = 0;
      do {
        dVar4 = (pdVar12 + lVar13)[1] + (x0 + lVar13)[1];
        auVar5._8_4_ = SUB84(dVar4,0);
        auVar5._0_8_ = pdVar12[lVar13] + x0[lVar13];
        auVar5._12_4_ = (int)((ulong)dVar4 >> 0x20);
        *(undefined1 (*) [16])(x0 + lVar13) = auVar5;
        lVar13 = lVar13 + 2;
      } while (lVar13 != 4);
      fprintf(__stream,"%f");
      fprintf(__stream_00,"%f",SUB84((double)iVar11 * 0.001,0));
      lVar13 = 0;
      do {
        fprintf(__stream,"\t%f",SUB84(x0[lVar13],0));
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      lVar13 = 0;
      do {
        fprintf(__stream_00,"\t%f",SUB84(u0[lVar13],0));
        lVar13 = lVar13 + 1;
      } while (lVar13 != 6);
      local_d8 = local_d8 + ((dVar6 * 1e-06 + dVar3) - ((double)_Var10 * 1e-06 + (double)_Var9));
      fputc(10,__stream);
      fputc(10,__stream_00);
      iVar11 = iVar11 + 1;
    } while (iVar11 != 0x4e21);
    fclose(__stream);
    fclose(__stream_00);
    printf("Elapsed time = %f\n",SUB84(local_d8,0));
    p0 = local_a8;
  }
  operator_delete__(x0);
  operator_delete__(u0);
  operator_delete__(pdVar12);
  operator_delete__(p0);
  Cgmres<Model>::~Cgmres(&local_a0);
  return 0;
}

Assistant:

int main(void) {
  //---------------------------
  FILE* fp_x;
  FILE* fp_u;

  double t_start, t_end, t_all = 0;

  double* x;
  double* u;
  double* dxdt;
  double* pt;

  x = new double[Simulator::dim_x];
  u = new double[Simulator::dim_u];
  dxdt = new double[Simulator::dim_x];
  pt = new double[Simulator::dim_p * (Simulator::dv + 1)];

  // mass_spring_damper
  x[0] = 2.0;
  x[1] = 2.0;
  x[2] = 0.0;
  x[3] = 0.0;

  u[0] = 0.0;
  u[1] = 0.0;
  u[2] = 10.0;
  u[3] = 10.0;
  u[4] = 5e-4;
  u[5] = 5e-4;

  dxdt[0] = 0.0;
  dxdt[1] = 0.0;
  dxdt[2] = 0.0;
  dxdt[3] = 0.0;

  for (int i = 0; i < Simulator::dv + 1; i++) {
    pt[Simulator::dim_p * i + 0] = 1;
    pt[Simulator::dim_p * i + 1] = -1;
  }

  Cgmres<Model> controller;
  controller.set_ptau(pt);
  controller.init_u0(u);
  controller.init_u0_newton(u, x, pt, 10);

  fp_x = fopen("mass_spring_damper_x.txt", "w");
  fp_u = fopen("mass_spring_damper_u.txt", "w");

  if (NULL != fp_x && NULL != fp_u) {
    for (int i = 0; i <= (int)(Simulator::t_end / Simulator::dt); i++) {
      // Test code
      t_start = getEtime();
      controller.control(u, x);
      t_end = getEtime();
      t_all += (t_end - t_start);

      // x = x + dxdt * dt
      Simulator::dxdt(dxdt, x, u);
      mul(dxdt, dxdt, Simulator::dt, Simulator::dim_x);
      add(x, x, dxdt, Simulator::dim_x);

      fprintf(fp_x, "%f", Simulator::dt * i);
      fprintf(fp_u, "%f", Simulator::dt * i);
      for (int j = 0; j < Simulator::dim_x; j++) {
        fprintf(fp_x, "\t%f", x[j]);
      }
      for (int j = 0; j < Simulator::dim_u; j++) {
        fprintf(fp_u, "\t%f", u[j]);
      }
      fprintf(fp_x, "\n");
      fprintf(fp_u, "\n");
    }

    fclose(fp_x);
    fclose(fp_u);

    printf("Elapsed time = %f\n", t_all);
  }

  delete[] x;
  delete[] u;
  delete[] dxdt;
  delete[] pt;

  return 0;
}